

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_model.c
# Opt level: O2

CAPIExample * MakeCAPIExample_Linear_01(void)

{
  CAPIExample *in_RDI;
  
  in_RDI->n_var = 2;
  in_RDI->n_var_int = 1;
  in_RDI->n_con = 2;
  in_RDI->n_obj = 1;
  in_RDI->var_lb = MakeCAPIExample_Linear_01::var_lb;
  in_RDI->var_ub = MakeCAPIExample_Linear_01::var_ub;
  in_RDI->var_name = MakeCAPIExample_Linear_01::var_name;
  in_RDI->con_lb = MakeCAPIExample_Linear_01::con_lb;
  in_RDI->con_ub = MakeCAPIExample_Linear_01::con_ub;
  in_RDI->con_name = MakeCAPIExample_Linear_01::con_name;
  in_RDI->row_nnz = MakeCAPIExample_Linear_01::row_nnz;
  in_RDI->con_linpart = MakeCAPIExample_Linear_01::rows;
  in_RDI->col_sizes = MakeCAPIExample_Linear_01::col_sizes;
  in_RDI->n_con_nz = 4;
  in_RDI->obj_sense = 1;
  in_RDI->obj_linpart = MakeCAPIExample_Linear_01::obj_linpart;
  in_RDI->n_obj_nz = 2;
  in_RDI->obj_name = "TotalSum";
  in_RDI->ini_x = MakeCAPIExample_Linear_01::ini_x;
  in_RDI->ini_y = MakeCAPIExample_Linear_01::ini_y;
  in_RDI->n_suf = 1;
  in_RDI->suf = MakeCAPIExample_Linear_01::suf;
  in_RDI->binary_nl = 1;
  in_RDI->sol_dual_ = MakeCAPIExample_Linear_01::sol_dual;
  in_RDI->sol_primal_ = MakeCAPIExample_Linear_01::sol_primal;
  in_RDI->objno_ = -2;
  in_RDI->solve_code_ = -100;
  return in_RDI;
}

Assistant:

CAPIExample MakeCAPIExample_Linear_01(void) {
  /// Variables.
  /// Put y first because continuous variables
  /// come before integer ones.
  static const double
      var_lb[] = {-17, 0};
  static const double
      var_ub[] = {504, INFINITY};
  static const char* const
      var_name[] = {"y", "x"};

  /// Constraints
  static const double
      con_lb[] =   {-INFINITY, -INFINITY};
  static const double
      con_ub[] =   {      3e4,       3e5};
  static const char* const
      con_name[] = {     "C2",      "C3"};

  /// Constraint matrix
  static const SparseEntry row_01[]
      = { {0, 0.6}, {1, 3700} };
  static const SparseEntry row_02[]
      = { {0, 14536}, {1, 22} };
  static const SparseEntry* const rows[] = {row_01, row_02};

  static int row_nnz[] = {2, 2};
  static int col_sizes[] = {2};

  /// Objective
  static const SparseEntry obj_linpart[]
      = { {0, 13}, {1, 1.0} };

  static const double ini_x[] = {30.15, 15.11};
  static const double ini_y[] = {-10, -120};

  static const SparseEntry suf_val[] = {{0, 5.3}};

  static int n_suf = 1;
  static const Suffix suf[] = {
    {"zork", 1+4,   // constraints, float-valued
     1, suf_val}
  };

  /// Solution
  static double sol_dual[] = {NAN, NAN};
  static double sol_primal[] = {NAN, NAN};

  CAPIExample result = {
    .n_var = 2,
    .n_var_int = 1,
    .n_con = 2,
    .n_obj = 1,

    .var_lb = var_lb,
    .var_ub = var_ub,
    .var_name = var_name,

    .con_lb = con_lb,
    .con_ub = con_ub,
    .con_name = con_name,

    .con_linpart = rows,
    .row_nnz = row_nnz,
    .col_sizes = col_sizes,
    .n_con_nz = 4,

    .obj_sense = 1,
    .obj_linpart = obj_linpart,
    .n_obj_nz = 2,
    .obj_name = "TotalSum",

    .ini_x = ini_x,
    .ini_y = ini_y,

    .n_suf = n_suf,
    .suf = suf,

    .binary_nl = 1,

    .sol_dual_ = sol_dual,
    .sol_primal_ = sol_primal,
    .objno_ = -2,
    .solve_code_ = -100
  };
  return result;
}